

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O3

int jpc_dec_cp_setfromqcd(jpc_dec_cp_t *cp,jpc_qcd_t *qcd)

{
  int in_EAX;
  int in_ECX;
  int iVar1;
  jpc_dec_ccp_t *cp_00;
  
  if (0 < cp->numcomps) {
    cp_00 = cp->ccps;
    iVar1 = 0;
    do {
      in_EAX = jpc_dec_cp_setfromqcx
                         ((jpc_dec_cp_t *)cp_00,(jpc_dec_ccp_t *)qcd,(jpc_qcxcp_t *)0x0,in_ECX);
      iVar1 = iVar1 + 1;
      cp_00 = cp_00 + 1;
    } while (iVar1 < cp->numcomps);
  }
  *(byte *)&cp->flags = (byte)cp->flags | 2;
  return in_EAX;
}

Assistant:

static int jpc_dec_cp_setfromqcd(jpc_dec_cp_t *cp, jpc_qcd_t *qcd)
{
	int compno;
	jpc_dec_ccp_t *ccp;
	for (compno = 0, ccp = cp->ccps; compno < cp->numcomps;
	  ++compno, ++ccp) {
		jpc_dec_cp_setfromqcx(cp, ccp, &qcd->compparms, 0);
	}
	cp->flags |= JPC_QSET;
	return 0;
}